

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_padding.cpp
# Opt level: O0

Padder icu_63::number::impl::Padder::forProperties(DecimalFormatProperties *properties)

{
  Padder PVar1;
  int32_t iVar2;
  UNumberFormatPadPosition position;
  UChar32 local_24;
  UChar32 padCp;
  DecimalFormatProperties *properties_local;
  undefined4 local_c;
  
  iVar2 = UnicodeString::length(&properties->padString);
  if (iVar2 < 1) {
    local_24 = 0x20;
  }
  else {
    local_24 = UnicodeString::char32At(&properties->padString,0);
  }
  iVar2 = properties->formatWidth;
  position = NullableValue<UNumberFormatPadPosition>::getOrDefault
                       (&properties->padPosition,UNUM_PAD_BEFORE_PREFIX);
  Padder((Padder *)((long)&properties_local + 4),local_24,iVar2,position);
  PVar1.fUnion.padding.fPosition = local_c;
  PVar1._0_8_ = stack0xffffffffffffffec;
  return PVar1;
}

Assistant:

Padder Padder::forProperties(const DecimalFormatProperties& properties) {
    UChar32 padCp;
    if (properties.padString.length() > 0) {
        padCp = properties.padString.char32At(0);
    } else {
        padCp = kFallbackPaddingString[0];
    }
    return {padCp, properties.formatWidth, properties.padPosition.getOrDefault(UNUM_PAD_BEFORE_PREFIX)};
}